

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.cpp
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::FixedCol::undo
          (FixedCol *this,HighsOptions *options,
          vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
          *colValues,HighsSolution *solution,HighsBasis *basis)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pNVar5;
  size_type sVar6;
  reference pvVar7;
  long in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  value_type *in_RDI;
  byte *in_R8;
  double dVar8;
  Nonzero *colVal;
  const_iterator __end1;
  const_iterator __begin1;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *__range1;
  HighsCDouble reducedCost;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  value_type vVar9;
  undefined1 in_stack_ffffffffffffff7f;
  HighsCDouble *in_stack_ffffffffffffff80;
  __normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
  local_48;
  undefined8 local_40;
  HighsCDouble local_38;
  byte *local_28;
  long local_20;
  undefined8 local_18;
  
  local_18 = CONCAT71(in_register_00000011,in_DL);
  vVar1 = *in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),
                      (long)*(int *)(in_RDI + 2));
  *pvVar4 = vVar1;
  if ((*(byte *)(local_20 + 1) & 1) != 0) {
    HighsCDouble::HighsCDouble(&local_38,in_RDI[1]);
    local_40 = local_18;
    local_48._M_current =
         (Nonzero *)
         std::
         vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
         ::begin((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                  *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        in_stack_ffffffffffffff78)))));
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ::end((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                )))));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff7f,
                                          CONCAT16(in_stack_ffffffffffffff7e,
                                                   CONCAT15(in_stack_ffffffffffffff7d,
                                                            CONCAT14(in_stack_ffffffffffffff7c,
                                                                     in_stack_ffffffffffffff78))))),
          bVar3) {
      pNVar5 = __gnu_cxx::
               __normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
               ::operator*(&local_48);
      iVar2 = pNVar5->index;
      sVar6 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50));
      if ((ulong)(long)iVar2 < sVar6) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_20 + 0x50),(long)pNVar5->index)
        ;
        HighsCDouble::operator-=
                  (in_stack_ffffffffffffff80,
                   (double)CONCAT17(in_stack_ffffffffffffff7f,
                                    CONCAT16(in_stack_ffffffffffffff7e,
                                             CONCAT15(in_stack_ffffffffffffff7d,
                                                      CONCAT14(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78)))));
      }
      __gnu_cxx::
      __normal_iterator<const_presolve::HighsPostsolveStack::Nonzero_*,_std::vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>_>
      ::operator++(&local_48);
    }
    dVar8 = HighsCDouble::operator_cast_to_double(&local_38);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                        (long)*(int *)(in_RDI + 2));
    *pvVar4 = dVar8;
    if ((*local_28 & 1) != 0) {
      vVar9 = *(value_type *)((long)in_RDI + 0x14);
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_28 + 0x30),(long)*(int *)(in_RDI + 2));
      *pvVar7 = vVar9;
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_28 + 0x30),(long)*(int *)(in_RDI + 2));
      if (*pvVar7 == kNonbasic) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                            (long)*(int *)(in_RDI + 2));
        vVar9 = kLower;
        if (*pvVar4 < 0.0) {
          vVar9 = kUpper;
        }
        pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (local_28 + 0x30),(long)*(int *)(in_RDI + 2));
        *pvVar7 = vVar9;
      }
    }
  }
  return;
}

Assistant:

void HighsPostsolveStack::FixedCol::undo(const HighsOptions& options,
                                         const std::vector<Nonzero>& colValues,
                                         HighsSolution& solution,
                                         HighsBasis& basis) const {
  // set solution value
  solution.col_value[col] = fixValue;

  if (!solution.dual_valid) return;

  // compute reduced cost

  HighsCDouble reducedCost = colCost;
  for (const auto& colVal : colValues) {
    if (static_cast<size_t>(colVal.index) < solution.row_dual.size())
      reducedCost -= colVal.value * solution.row_dual[colVal.index];
  }

  solution.col_dual[col] = double(reducedCost);

  // set basis status
  if (basis.valid) {
    basis.col_status[col] = fixType;
    if (basis.col_status[col] == HighsBasisStatus::kNonbasic)
      basis.col_status[col] = solution.col_dual[col] >= 0
                                  ? HighsBasisStatus::kLower
                                  : HighsBasisStatus::kUpper;
  }
}